

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitmapDevice.cpp
# Opt level: O1

void __thiscall
TRM::BitmapDevice::Triangle
          (BitmapDevice *this,Vec3f *a,Vec3f *b,Vec3f *c,Color *ca,Color *cb,Color *cc)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  uint32_t uVar15;
  uint uVar16;
  uint uVar17;
  element_type *peVar18;
  pointer pfVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  int j;
  int iVar29;
  int iVar30;
  int iVar31;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar32;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aVar33;
  undefined8 uVar34;
  undefined8 extraout_XMM0_Qb;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar35;
  float fVar36;
  undefined4 uVar38;
  undefined4 uVar39;
  undefined4 uVar40;
  float fVar41;
  ulong uVar42;
  vec<3,_float,_(glm::qualifier)0> A;
  vec<3,_float,_(glm::qualifier)0> B;
  vec<3,_float,_(glm::qualifier)0> C;
  vec<3,_float,_(glm::qualifier)0> P;
  array<glm::vec<3,_float,_(glm::qualifier)0>,_3UL> pts;
  Color local_13c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_138;
  float local_134;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_130;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_12c;
  undefined8 local_128;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  float local_ec;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_c0;
  float fStack_bc;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_b8;
  float local_b4;
  float fStack_b0;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_ac;
  float local_a8;
  float fStack_a4;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 local_68;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_64;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_60;
  anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5 aStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar37;
  Vec3f VVar43;
  
  peVar18 = (this->mBitmap).super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar15 = peVar18->fWidth;
  uVar16 = *(uint *)(ca->fRGBA)._M_elems;
  local_98._0_4_ = uVar16;
  local_138 = *(anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
               (cb->fRGBA)._M_elems;
  uVar17 = *(uint *)(cc->fRGBA)._M_elems;
  fVar41 = (a->field_0).x;
  fVar36 = (a->field_1).y;
  fVar2 = (a->field_2).z;
  uVar7 = (this->mMatrix).value[0].field_0;
  uVar11 = (this->mMatrix).value[0].field_1;
  fVar3 = (this->mMatrix).value[0].field_2.z;
  uVar8 = (this->mMatrix).value[1].field_0;
  uVar12 = (this->mMatrix).value[1].field_1;
  fVar4 = (this->mMatrix).value[1].field_2.z;
  uVar9 = (this->mMatrix).value[2].field_0;
  uVar13 = (this->mMatrix).value[2].field_1;
  fVar5 = (this->mMatrix).value[2].field_2.z;
  uVar10 = (this->mMatrix).value[3].field_0;
  uVar14 = (this->mMatrix).value[3].field_1;
  local_c0.z = fVar2 * (float)uVar9 + (float)uVar10 + fVar36 * (float)uVar8 + fVar41 * (float)uVar7;
  fStack_bc = fVar2 * (float)uVar13 + (float)uVar14 +
              fVar36 * (float)uVar12 + fVar41 * (float)uVar11;
  fVar6 = (this->mMatrix).value[3].field_2.z;
  local_12c.z = fVar2 * fVar5 + fVar6 + fVar36 * fVar4 + fVar41 * fVar3;
  local_b8.z = local_12c.z;
  fVar41 = (b->field_0).x;
  fVar36 = (b->field_1).y;
  fVar2 = (b->field_2).z;
  local_b4 = (float)uVar9 * fVar2 + (float)uVar10 + (float)uVar8 * fVar36 + (float)uVar7 * fVar41;
  fStack_b0 = (float)uVar13 * fVar2 + (float)uVar14 +
              (float)uVar12 * fVar36 + (float)uVar11 * fVar41;
  local_130.z = fVar2 * fVar5 + fVar6 + fVar36 * fVar4 + fVar41 * fVar3;
  local_ac.z = local_130.z;
  fVar41 = (c->field_0).x;
  fVar36 = (c->field_1).y;
  local_a8 = (float)uVar8 * fVar36 + (float)uVar7 * fVar41;
  uVar42 = (ulong)(uint)local_a8;
  fVar2 = (c->field_2).z;
  local_a8 = (float)uVar9 * fVar2 + (float)uVar10 + local_a8;
  fStack_a4 = (float)uVar13 * fVar2 + (float)uVar14 +
              (float)uVar12 * fVar36 + (float)uVar11 * fVar41;
  aVar35.z = fVar5 * fVar2 + fVar6 + fVar4 * fVar36 + fVar3 * fVar41;
  iVar21 = uVar15 - 1;
  iVar30 = peVar18->fHeight - 1;
  local_a0.z = aVar35.z;
  lVar28 = 0;
  iVar27 = 0;
  iVar26 = 0;
  iVar25 = iVar21;
  iVar22 = iVar30;
  do {
    iVar29 = 0;
    do {
      iVar24 = iVar25;
      if (iVar29 == 1) {
        iVar24 = iVar22;
      }
      paVar32 = &local_b8 + lVar28 * 3;
      if ((iVar29 != 2) && (paVar32 = &local_c0 + lVar28 * 3, iVar29 == 1)) {
        paVar32 = &local_c0 + lVar28 * 3 + 1;
      }
      fVar41 = paVar32->z;
      if ((float)iVar24 <= paVar32->z) {
        fVar41 = (float)iVar24;
      }
      if (fVar41 <= 0.0) {
        fVar41 = 0.0;
      }
      iVar31 = iVar26;
      iVar20 = (int)fVar41;
      iVar24 = iVar30;
      if (iVar29 != 1) {
        iVar31 = iVar27;
        iVar25 = (int)fVar41;
        iVar20 = iVar22;
        iVar24 = iVar21;
      }
      iVar22 = iVar20;
      paVar32 = &local_b8 + lVar28 * 3;
      if ((iVar29 != 2) && (paVar32 = &local_c0 + lVar28 * 3, iVar29 == 1)) {
        paVar32 = &local_c0 + lVar28 * 3 + 1;
      }
      fVar41 = paVar32->z;
      if (paVar32->z <= (float)iVar31) {
        fVar41 = (float)iVar31;
      }
      if ((float)iVar24 <= fVar41) {
        fVar41 = (float)iVar24;
      }
      iVar24 = (int)fVar41;
      if (iVar29 != 1) {
        iVar27 = (int)fVar41;
        iVar24 = iVar26;
      }
      iVar26 = iVar24;
      iVar29 = iVar29 + 1;
    } while (iVar29 == 1);
    lVar28 = lVar28 + 1;
  } while (lVar28 != 3);
  uVar34 = 0;
  local_128._0_4_ = (float)iVar25;
  local_110 = (float)iVar27;
  if ((float)local_128 <= local_110) {
    local_134 = (float)iVar26;
    local_dc = (float)(int)uVar15;
    local_e0 = (float)(uVar16 & 0xff);
    local_e4 = (float)((uint)local_138 & 0xff);
    local_e8 = (float)(uVar17 & 0xff);
    local_ec = (float)(uVar16 >> 8 & 0xff);
    local_f0 = (float)((uint)local_138 >> 8 & 0xff);
    local_f4 = (float)(uVar17 >> 8 & 0xff);
    local_f8 = (float)(uVar16 >> 0x10 & 0xff);
    local_48 = CONCAT44(fStack_bc,local_c0);
    uStack_40 = 0;
    local_fc = (float)((uint)local_138 >> 0x10 & 0xff);
    local_58 = CONCAT44(fStack_b0,local_b4);
    uStack_50 = 0;
    local_100 = (float)(uVar17 >> 0x10 & 0xff);
    local_104 = (float)(uVar16 >> 0x18);
    local_108 = (float)((uint)local_138 >> 0x18);
    local_10c = (float)(uVar17 >> 0x18);
    local_88 = CONCAT44(fStack_a4,local_a8);
    uStack_80 = 0;
    local_78 = ZEXT416((uint)(float)iVar22);
    fVar41 = (float)iVar22;
    uVar38 = 0;
    uVar39 = 0;
    uVar40 = 0;
    do {
      uStack_120 = (undefined4)uVar34;
      uStack_11c = (undefined4)((ulong)uVar34 >> 0x20);
      if (fVar41 <= local_134) {
        _local_d8 = CONCAT44(uVar38,fVar41);
        _uStack_d0 = CONCAT44(uVar40,uVar39);
        do {
          local_128 = CONCAT44(fVar41,(float)local_128);
          A.field_2.z = local_12c.z;
          A.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                      (undefined4)local_48;
          A.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_48._4_4_
          ;
          B.field_2.z = local_130.z;
          B.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                      (undefined4)local_58;
          B.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_58._4_4_
          ;
          C.field_2.z = aVar35.z;
          C.field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)
                      (undefined4)local_88;
          C.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_88._4_4_
          ;
          P.field_2 = SUB84(uVar42,0);
          P.field_0.x = (float)local_128;
          P.field_1.y = fVar41;
          uVar42 = uVar42 & 0xffffffff;
          VVar43 = barycentric<3ul>(A,B,C,P);
          aVar37 = VVar43.field_2;
          aVar33 = VVar43.field_1;
          if (((0.0 <= VVar43.field_0.x) && (0.0 <= aVar33.y)) && (0.0 <= aVar37.z)) {
            fVar36 = local_d8 * local_dc + (float)local_128;
            uVar23 = (ulong)fVar36;
            fVar41 = aVar35.z * aVar37.z + local_12c.z * VVar43.field_0.x + local_130.z * aVar33.y;
            uVar23 = (long)(fVar36 - 9.223372e+18) & (long)uVar23 >> 0x3f | uVar23;
            pfVar19 = (this->mZBuffer).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pfVar1 = pfVar19 + uVar23;
            if (fVar41 < *pfVar1 || fVar41 == *pfVar1) {
              pfVar19[uVar23] = fVar41;
              local_98._8_4_ = (int)extraout_XMM0_Qb;
              local_98._0_8_ = VVar43._0_8_;
              local_98._12_4_ = (int)((ulong)extraout_XMM0_Qb >> 0x20);
              local_138 = aVar37;
              local_68 = aVar33;
              aStack_64 = aVar33;
              aStack_60 = aVar33;
              aStack_5c = aVar33;
              Color::Color(&local_13c);
              local_13c.fRGBA._M_elems[0] =
                   (uchar)(int)(local_138.z * local_e8 +
                               (float)local_98._0_4_ * local_e0 + local_68.y * local_e4);
              local_13c.fRGBA._M_elems[1] =
                   (uchar)(int)(local_138.z * local_f4 +
                               (float)local_98._0_4_ * local_ec + local_68.y * local_f0);
              local_13c.fRGBA._M_elems[2] =
                   (uchar)(int)(local_138.z * local_100 +
                               (float)local_98._0_4_ * local_f8 + local_68.y * local_fc);
              local_13c.fRGBA._M_elems[3] =
                   (uchar)(int)(local_138.z * local_10c +
                               (float)local_98._0_4_ * local_104 + local_68.y * local_108);
              Bitmap::SetPixel((this->mBitmap).
                               super___shared_ptr<TRM::Bitmap,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                               (uint32_t)(long)(float)local_128,(uint32_t)(long)local_d8,&local_13c)
              ;
            }
          }
          fVar41 = local_d8 + 1.0;
          uVar34 = CONCAT44(uStack_11c,uStack_120);
          _local_d8 = CONCAT44(uStack_d4,fVar41);
        } while (fVar41 <= local_134);
      }
      fVar36 = (float)local_128 + 1.0;
      local_128._0_4_ = (float)local_128 + 1.0;
      fVar41 = (float)local_78._0_4_;
      uVar38 = local_78._4_4_;
      uVar39 = local_78._8_4_;
      uVar40 = local_78._12_4_;
    } while (fVar36 <= local_110);
  }
  return;
}

Assistant:

void BitmapDevice::Triangle(Vec3f const& a, Vec3f const& b, Vec3f const& c,
                            Color const& ca, Color const& cb, Color const& cc) {
  int32_t bitmap_width = mBitmap->width();
  int32_t bitmap_height = mBitmap->height();

  Vec2i bboxmin(bitmap_width - 1, bitmap_height - 1);
  Vec2i bboxmax(0, 0);
  Vec2i clamp(bitmap_width - 1, bitmap_height - 1);

  std::array<Vec3f, 3> pts;
  std::array<Color, 3> colors{ca, cb, cc};

  pts[0] = mMatrix * Vec4f{a.x, a.y, a.z, 1.f};
  pts[1] = mMatrix * Vec4f{b.x, b.y, b.z, 1.f};
  pts[2] = mMatrix * Vec4f{c.x, c.y, c.z, 1.f};

  for (int i = 0; i < 3; i++) {
    for (int j = 0; j < 2; j++) {
      bboxmin[j] = (int)std::max(
          0.f, std::min(static_cast<float>(bboxmin[j]), pts[i][j]));
      bboxmax[j] =
          (int)std::min(static_cast<float>(clamp[j]),
                        std::max(static_cast<float>(bboxmax[j]), pts[i][j]));
    }
  }

  Vec3f p;
  for (p[0] = bboxmin.x; p[0] <= bboxmax.x; p[0]++) {
    for (p[1] = bboxmin.y; p[1] <= bboxmax.y; p[1]++) {
      Vec3f bc_screen = barycentric<3>(pts[0], pts[1], pts[2], p);
      if (bc_screen[0] < 0 || bc_screen[1] < 0 || bc_screen[2] < 0) continue;

      float pz = pts[0][2] * bc_screen[0] + pts[1][2] * bc_screen[1] +
                 pts[2][2] * bc_screen[2];

      size_t zIndex = static_cast<size_t>(p.x + p.y * bitmap_width);
      if (mZBuffer[zIndex] < pz) continue;

      mZBuffer[zIndex] = pz;

      Color c;
      /*
          barycentric result can also interpolation Color
      */

      c.rgba()[0] = bc_screen[0] * colors[0].rgba()[0] +
                    bc_screen[1] * colors[1].rgba()[0] +
                    bc_screen[2] * colors[2].rgba()[0];
      c.rgba()[1] = bc_screen[0] * colors[0].rgba()[1] +
                    bc_screen[1] * colors[1].rgba()[1] +
                    bc_screen[2] * colors[2].rgba()[1];
      c.rgba()[2] = bc_screen[0] * colors[0].rgba()[2] +
                    bc_screen[1] * colors[1].rgba()[2] +
                    bc_screen[2] * colors[2].rgba()[2];
      c.rgba()[3] = bc_screen[0] * colors[0].rgba()[3] +
                    bc_screen[1] * colors[1].rgba()[3] +
                    bc_screen[2] * colors[2].rgba()[3];

      mBitmap->SetPixel(static_cast<uint32_t>(p.x), static_cast<uint32_t>(p.y),
                        c);
    }
  }
}